

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::log_internal::LogMessage::LogMessageData::FinalizeEncodingAndFormat
          (LogMessageData *this)

{
  size_type __n;
  bool bVar1;
  LogSeverity severity;
  tid_t tid;
  int line;
  pointer pvVar2;
  Span<char> *this_00;
  pointer pcVar3;
  pointer pvVar4;
  uint64_t uVar5;
  WireType WVar6;
  reference pvVar7;
  string_view basename;
  Time timestamp;
  Span<const_char> buf;
  size_t local_100;
  Span<char> local_e0;
  Span<char> local_d0;
  Span<const_char> local_c0;
  size_type local_b0;
  size_t chars_written;
  pointer local_a0;
  undefined1 local_98 [8];
  ProtoField field;
  HiRep local_50;
  undefined1 local_30 [8];
  Span<char> string_remaining;
  Span<const_char> encoded_data;
  LogMessageData *this_local;
  
  pvVar2 = std::array<char,_15000UL>::data(&this->encoded_buf);
  this_00 = encoded_remaining(this);
  pcVar3 = Span<char>::data(this_00);
  pvVar4 = std::array<char,_15000UL>::data(&this->encoded_buf);
  Span<const_char>::Span
            ((Span<const_char> *)&string_remaining.len_,pvVar2,(long)pcVar3 - (long)pvVar4);
  Span<char>::Span<std::array<char,15000ul>,void,std::array<char,15000ul>,int>
            ((Span<char> *)local_30,&this->string_buf);
  Span<char>::remove_suffix((Span<char> *)local_30,2);
  bVar1 = LogEntry::prefix(&this->entry);
  if (bVar1) {
    severity = LogEntry::log_severity(&this->entry);
    timestamp = LogEntry::timestamp(&this->entry);
    local_50 = timestamp.rep_.rep_hi_;
    tid = LogEntry::tid(&this->entry);
    basename = LogEntry::source_basename(&this->entry);
    line = LogEntry::source_line(&this->entry);
    bVar1 = ThreadIsLoggingToLogSink();
    field.data_.len_._0_4_ = local_50.lo_;
    field.data_.len_._4_4_ = local_50.hi_;
    local_100 = FormatLogPrefix(severity,timestamp,tid,basename,line,(uint)bVar1,
                                (Span<char> *)local_30);
  }
  else {
    local_100 = 0;
  }
  (this->entry).prefix_len_ = local_100;
  ProtoField::ProtoField((ProtoField *)local_98);
  while (bVar1 = ProtoField::DecodeFrom
                           ((ProtoField *)local_98,(Span<const_char> *)&string_remaining.len_),
        bVar1) {
    uVar5 = ProtoField::tag((ProtoField *)local_98);
    if ((uVar5 == 7) &&
       (WVar6 = ProtoField::type((ProtoField *)local_98), WVar6 == kLengthDelimited)) {
      _chars_written = ProtoField::bytes_value((ProtoField *)local_98);
      buf.len_ = local_100;
      buf.ptr_ = local_a0;
      anon_unknown_4::PrintValue((anon_unknown_4 *)local_30,(Span<char> *)chars_written,buf);
    }
  }
  pcVar3 = Span<char>::data((Span<char> *)local_30);
  pvVar2 = std::array<char,_15000UL>::data(&this->string_buf);
  local_b0 = ((long)pcVar3 - (long)pvVar2) + 1;
  pvVar7 = std::array<char,_15000UL>::operator[](&this->string_buf,(long)pcVar3 - (long)pvVar2);
  __n = local_b0;
  *pvVar7 = '\n';
  local_b0 = local_b0 + 1;
  pvVar7 = std::array<char,_15000UL>::operator[](&this->string_buf,__n);
  *pvVar7 = '\0';
  local_e0 = MakeSpan<std::array<char,_15000UL>_>(&this->string_buf);
  local_d0 = Span<char>::subspan(&local_e0,0,local_b0);
  Span<const_char>::Span<absl::lts_20250127::Span<char>,_void,_absl::lts_20250127::Span<char>,_0>
            (&local_c0,&local_d0);
  (this->entry).text_message_with_prefix_and_newline_and_nul_.ptr_ = local_c0.ptr_;
  (this->entry).text_message_with_prefix_and_newline_and_nul_.len_ = local_c0.len_;
  return;
}

Assistant:

void LogMessage::LogMessageData::FinalizeEncodingAndFormat() {
  // Note that `encoded_remaining()` may have zero size without pointing past
  // the end of `encoded_buf`, so the difference between `data()` pointers is
  // used to compute the size of `encoded_data`.
  absl::Span<const char> encoded_data(
      encoded_buf.data(),
      static_cast<size_t>(encoded_remaining().data() - encoded_buf.data()));
  // `string_remaining` is the suffix of `string_buf` that has not been filled
  // yet.
  absl::Span<char> string_remaining(string_buf);
  // We may need to write a newline and nul-terminator at the end of the decoded
  // string data.  Rather than worry about whether those should overwrite the
  // end of the string (if the buffer is full) or be appended, we avoid writing
  // into the last two bytes so we always have space to append.
  string_remaining.remove_suffix(2);
  entry.prefix_len_ =
      entry.prefix() ? log_internal::FormatLogPrefix(
                           entry.log_severity(), entry.timestamp(), entry.tid(),
                           entry.source_basename(), entry.source_line(),
                           log_internal::ThreadIsLoggingToLogSink()
                               ? PrefixFormat::kRaw
                               : PrefixFormat::kNotRaw,
                           string_remaining)
                     : 0;
  // Decode data from `encoded_buf` until we run out of data or we run out of
  // `string_remaining`.
  ProtoField field;
  while (field.DecodeFrom(&encoded_data)) {
    switch (field.tag()) {
      case EventTag::kValue:
        if (field.type() != WireType::kLengthDelimited) continue;
        if (PrintValue(string_remaining, field.bytes_value())) continue;
        break;
    }
  }
  auto chars_written =
      static_cast<size_t>(string_remaining.data() - string_buf.data());
    string_buf[chars_written++] = '\n';
  string_buf[chars_written++] = '\0';
  entry.text_message_with_prefix_and_newline_and_nul_ =
      absl::MakeSpan(string_buf).subspan(0, chars_written);
}